

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lsp_launcher.cpp
# Opt level: O2

void lscpp::write_lsp_message(transporter *t,string *content)

{
  _Head_base<0UL,_lscpp::transporter::iface_*,_false> _Var1;
  allocator<char> local_1c1;
  string local_1c0 [32];
  stringstream content_length;
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&content_length);
  std::operator<<(local_190,"Content-Length: ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__cxx11::stringbuf::str();
  _Var1._M_head_impl =
       (t->impl_)._M_t.
       super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
       ._M_t.
       super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
       .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_iface[4])(_Var1._M_head_impl,local_1c0,1);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"",&local_1c1);
  _Var1._M_head_impl =
       (t->impl_)._M_t.
       super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
       ._M_t.
       super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
       .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_iface[4])(_Var1._M_head_impl,local_1c0,1);
  std::__cxx11::string::~string(local_1c0);
  _Var1._M_head_impl =
       (t->impl_)._M_t.
       super___uniq_ptr_impl<lscpp::transporter::iface,_std::default_delete<lscpp::transporter::iface>_>
       ._M_t.
       super__Tuple_impl<0UL,_lscpp::transporter::iface_*,_std::default_delete<lscpp::transporter::iface>_>
       .super__Head_base<0UL,_lscpp::transporter::iface_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_iface[4])(_Var1._M_head_impl,content,0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&content_length);
  return;
}

Assistant:

void write_lsp_message(transporter &t, std::string const &content) {
  std::stringstream content_length;
  content_length << "Content-Length: ";
  content_length << content.size();
  t.write_message(content_length.str(), true);
  t.write_message("", true);

  t.write_message(content);
}